

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_arith(lua_State *L,int op)

{
  StkId pSVar1;
  long lVar2;
  TValue *io2;
  TValue *io1;
  int op_local;
  lua_State *L_local;
  
  if ((op == 0xc) || (op == 0xd)) {
    pSVar1 = (L->top).p;
    lVar2 = (L->top).offset;
    (pSVar1->val).value_ = *(Value *)(lVar2 + -0x10);
    (pSVar1->val).tt_ = *(lu_byte *)(lVar2 + -8);
    (L->top).p = (StkId)((L->top).offset + 0x10);
  }
  luaO_arith(L,op,(TValue *)((L->top).offset + -0x20),(TValue *)((L->top).offset + -0x10),
             (StkId)((L->top).offset + -0x20));
  (L->top).p = (StkId)((L->top).offset + -0x10);
  return;
}

Assistant:

LUA_API void lua_arith (lua_State *L, int op) {
  lua_lock(L);
  if (op != LUA_OPUNM && op != LUA_OPBNOT)
    api_checknelems(L, 2);  /* all other operations expect two operands */
  else {  /* for unary operations, add fake 2nd operand */
    api_checknelems(L, 1);
    setobjs2s(L, L->top.p, L->top.p - 1);
    api_incr_top(L);
  }
  /* first operand at top - 2, second at top - 1; result go to top - 2 */
  luaO_arith(L, op, s2v(L->top.p - 2), s2v(L->top.p - 1), L->top.p - 2);
  L->top.p--;  /* remove second operand */
  lua_unlock(L);
}